

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.cc
# Opt level: O2

void __thiscall flow::PassManager::run(PassManager *this,IRHandler *handler)

{
  bool bVar1;
  int args;
  size_t in_RCX;
  uchar *sig;
  char *ctx;
  uchar *in_R8;
  size_t in_R9;
  _List_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  args = 0;
  p_Var2 = (_List_node_base *)this;
  do {
    while (p_Var2 = (((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                       *)&p_Var2->_M_next)->
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)this) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 1));
      logDebug<std::__cxx11::string>(this,"executing pass {}:",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = std::function<bool_(flow::IRHandler_*)>::operator()
                        ((function<bool_(flow::IRHandler_*)> *)(p_Var2 + 3),handler);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_70,(string *)(p_Var2 + 1));
        ctx = "pass {}: changes detected";
        logDebug<std::__cxx11::string>(this,"pass {}: changes detected",&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        IRHandler::verify(handler,(EVP_PKEY_CTX *)ctx,sig,in_RCX,in_R8,in_R9);
        args = args + 1;
      }
    }
    logDebug<int>(this,"{} changes detected",args);
    bVar1 = args != 0;
    args = 0;
    p_Var2 = (_List_node_base *)this;
  } while (bVar1);
  return;
}

Assistant:

void PassManager::run(IRHandler* handler) {
  for (;;) {
    int changes = 0;
    for (const std::pair<std::string, HandlerPass>& pass : handlerPasses_) {
      logDebug("executing pass {}:", pass.first);
      if (pass.second(handler)) {
        logDebug("pass {}: changes detected", pass.first);
        handler->verify();
        changes++;
      }
    }
    logDebug("{} changes detected", changes);
    if (!changes) {
      break;
    }
  }
}